

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

Gia_ManEra_t * Gia_ManEraCreate(Gia_Man_t *pAig)

{
  int iVar1;
  Gia_ManEra_t *pGVar2;
  uint *__s;
  Mem_Fixed_t *pMVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint *puVar6;
  void *pvVar7;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  pGVar2 = (Gia_ManEra_t *)calloc(1,0x58);
  pGVar2->pAig = pAig;
  uVar12 = pAig->nRegs;
  iVar1 = pAig->vCis->nSize - uVar12;
  bVar9 = (char)iVar1 - 5;
  iVar11 = (((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
  uVar15 = 0;
  iVar14 = 1 << (bVar9 & 0x1f);
  if (iVar1 < 6) {
    iVar14 = 1;
  }
  pGVar2->nWordsSim = iVar14;
  pGVar2->nWordsDat = iVar11;
  if (iVar1 < 6) {
    bVar9 = 0;
  }
  __s = (uint *)malloc((long)(pAig->nObjs << (bVar9 & 0x1f)) << 2);
  pGVar2->pDataSim = __s;
  pMVar3 = Mem_FixedStart(iVar11 * 4 + 0x10);
  pGVar2->pMemory = pMVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800000);
  pVVar4->pArray = ppvVar5;
  pGVar2->vStates = pVVar4;
  iVar1 = Abc_PrimeCudd(100000);
  pGVar2->nBins = iVar1;
  puVar6 = (uint *)calloc((long)iVar1,4);
  pGVar2->pBins = puVar6;
  Vec_PtrPush(pVVar4,(void *)0x0);
  lVar13 = (long)pAig->vCis->nSize;
  iVar1 = pAig->nRegs;
  uVar16 = lVar13 - iVar1;
  iVar11 = (int)uVar16;
  uVar12 = 1 << ((char)uVar16 - 5U & 0x1f);
  if (iVar11 < 6) {
    uVar12 = 1;
  }
  ppvVar5 = (void **)malloc(((long)(int)uVar12 * 4 + 8) * uVar16);
  uVar17 = 0;
  if (0 < iVar11) {
    uVar17 = uVar16 & 0xffffffff;
  }
  lVar13 = lVar13 * 8 + (long)iVar1 * -8;
  for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
    ppvVar5[uVar15] = (void *)((long)ppvVar5 + lVar13);
    lVar13 = lVar13 + (long)(int)uVar12 * 4;
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nSize = iVar11;
  pVVar4->nCap = iVar11;
  pVVar4->pArray = ppvVar5;
  uVar16 = 0;
  uVar15 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar15 = uVar16;
  }
  for (; uVar16 != uVar17; uVar16 = uVar16 + 1) {
    pvVar7 = ppvVar5[uVar16];
    if (uVar16 < 5) {
      for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined4 *)((long)pvVar7 + uVar10 * 4) = (&DAT_0084f9f0)[uVar16];
      }
    }
    else {
      for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        *(uint *)((long)pvVar7 + uVar10 * 4) =
             -(uint)((1 << ((char)uVar16 - 5U & 0x1f) & (uint)uVar10) != 0);
      }
    }
  }
  iVar1 = 0;
  while( true ) {
    if ((int)uVar17 == iVar1) {
      Vec_PtrFree(pVVar4);
      memset(__s,0,(long)iVar14 << 2);
      pVVar8 = Vec_IntAlloc(1000);
      pGVar2->vStgDump = pVVar8;
      return pGVar2;
    }
    pvVar7 = Vec_PtrEntry(pVVar4,iVar1);
    if (pAig->vCis->nSize - pAig->nRegs <= iVar1) break;
    pObj = Gia_ManCi(pAig,iVar1);
    iVar11 = Gia_ObjId(pAig,pObj);
    memcpy(__s + (iVar11 << (bVar9 & 0x1f)),pvVar7,(long)iVar14 << 2);
    iVar1 = iVar1 + 1;
  }
  __assert_fail("v < Gia_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
}

Assistant:

Gia_ManEra_t * Gia_ManEraCreate( Gia_Man_t * pAig )
{
    Vec_Ptr_t * vTruths;
    Gia_ManEra_t * p;
    unsigned * pTruth, * pSimInfo;
    int i;
    p = ABC_CALLOC( Gia_ManEra_t, 1 );
    p->pAig      = pAig;
    p->nWordsSim = Abc_TruthWordNum( Gia_ManPiNum(pAig) );
    p->nWordsDat = Abc_BitWordNum( Gia_ManRegNum(pAig) );
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWordsSim*Gia_ManObjNum(pAig) );
    p->pMemory   = Mem_FixedStart( sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat );
    p->vStates   = Vec_PtrAlloc( 100000 );
    p->nBins     = Abc_PrimeCudd( 100000 );
    p->pBins     = ABC_CALLOC( unsigned, p->nBins );
    Vec_PtrPush( p->vStates, NULL );
    // assign primary input values
    vTruths = Vec_PtrAllocTruthTables( Gia_ManPiNum(pAig) );
    Vec_PtrForEachEntry( unsigned *, vTruths, pTruth, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(pAig, Gia_ManPi(pAig, i)) );
        memcpy( pSimInfo, pTruth, sizeof(unsigned) * p->nWordsSim );
    }
    Vec_PtrFree( vTruths );
    // assign constant zero node
    pSimInfo = Gia_ManEraData( p, 0 );
    memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    p->vStgDump = Vec_IntAlloc( 1000 );
    return p;
}